

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

field_logarithm_t field_mul_log(field_t field,field_logarithm_t l,field_logarithm_t r)

{
  field_operation_t res;
  field_logarithm_t r_local;
  field_logarithm_t l_local;
  field_t field_local;
  field_logarithm_t local_1;
  
  local_1 = (field_logarithm_t)((ushort)l + (ushort)r);
  if (0xff < (ushort)((ushort)l + (ushort)r)) {
    local_1 = local_1 + '\x01';
  }
  return local_1;
}

Assistant:

static inline field_logarithm_t field_mul_log(field_t field, field_logarithm_t l, field_logarithm_t r) {
    // this function performs the equivalent of field_mul on two logarithms
    // we save a little time by skipping the lookup step at the beginning
    field_operation_t res = (field_operation_t)l + (field_operation_t)r;

    // because we arent using the table, the value we return must be a valid logarithm
    // which we have decided must live in [0, 255] (they are 8-bit values)
    // ensuring this makes it so that multiple muls will not reach past the end of the
    // exp table whenever we finally convert back to an element
    if (res > 255) {
        return (field_logarithm_t)(res - 255);
    }
    return (field_logarithm_t)res;
}